

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O0

void helicsQueryBufferFill(HelicsQueryBuffer buffer,char *string,int stringSize,HelicsError *err)

{
  bool bVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  size_type in_RDI;
  string *bufferStr;
  undefined4 in_stack_00000010;
  char __c;
  
  if ((in_RCX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     (*(int *)&(in_RCX->_M_dataplus)._M_p == 0)) {
    if (in_RDI == 0) {
      assignError((HelicsError *)in_RCX,-3,"The given buffer is not valid");
    }
    else {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1f1193);
      if ((bVar1) ||
         (pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   back(in_RCX), *pvVar2 != '>')) {
        assignError((HelicsError *)in_RCX,-3,"The given buffer is not valid");
      }
      else if ((in_EDX < 1) ||
              (in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
      {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f11d8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (in_RSI,(char)((uint)in_EDX >> 0x18));
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  (bufferStr,in_RDI);
        __c = (char)((uint)in_EDX >> 0x18);
        std::__cxx11::string::assign<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(stringSize,in_stack_00000010),(char *)err,(char *)bufferStr);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (in_RSI,__c);
      }
    }
  }
  return;
}

Assistant:

void helicsQueryBufferFill(HelicsQueryBuffer buffer, const char* string, int stringSize, HelicsError* err)
{
    static constexpr const char* invalidBuffer = "The given buffer is not valid";

    if (((err) != nullptr) && ((err)->error_code != 0)) {
        return;
    }
    if (buffer == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBuffer);
        return;
    }

    auto* bufferStr = reinterpret_cast<std::string*>(buffer);
    if (bufferStr->empty() || bufferStr->back() != '>') {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBuffer);
        return;
    }
    if (stringSize <= 0 || string == nullptr) {
        bufferStr->clear();
        bufferStr->push_back('>');
        return;
    }
    bufferStr->reserve(static_cast<std::size_t>(stringSize) + 1);
    bufferStr->assign(string, string + stringSize);
    bufferStr->push_back('>');
}